

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# protocol.h
# Opt level: O3

void CAddress::
     SerializationOps<ParamsStream<DataStream&,CAddress::SerParams>,CAddress_const,ActionSerialize>
               (CNetAddr *obj,ParamsStream<DataStream_&,_CAddress::SerParams> *s)

{
  Encoding EVar1;
  SerParams *pSVar2;
  char *pcVar3;
  SerParams *pSVar4;
  long in_FS_OFFSET;
  bool bVar5;
  SerParams ser_params;
  uint64_t raw;
  SerParams local_44;
  ParamsStream<ParamsStream<DataStream_&,_CAddress::SerParams>_&,_CNetAddr::SerParams> local_40;
  Wrapper<CustomUintFormatter<2,_true>,_const_unsigned_short_&> local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pSVar2 = s->m_params;
  if (pSVar2->fmt == Network) {
    bVar5 = (pSVar2->super_SerParams).enc == V2;
  }
  else {
    if (pSVar2->fmt != Disk) {
      __assert_fail("params.fmt == Format::Network",
                    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/protocol.h"
                    ,0x1b2,
                    "static void CAddress::SerializationOps(Type &, Stream &, Operation) [Stream = ParamsStream<DataStream &, CAddress::SerParams>, Type = const CAddress, Operation = ActionSerialize]"
                   );
    }
    EVar1 = (pSVar2->super_SerParams).enc;
    local_40.m_params =
         (SerParams *)(CONCAT44(local_40.m_params._4_4_,(uint)(EVar1 == V2) << 0x1d) | 220000);
    std::vector<std::byte,zero_after_free_allocator<std::byte>>::_M_range_insert<std::byte_const*>
              ((vector<std::byte,zero_after_free_allocator<std::byte>> *)s->m_substream,
               (s->m_substream->vch).
               super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
               super__Vector_impl_data._M_finish,&local_40);
    if (EVar1 == V2) {
      bVar5 = true;
      if ((pSVar2->super_SerParams).enc != V2) {
        pcVar3 = (char *)__cxa_allocate_exception(0x20);
        local_40.m_substream =
             (ParamsStream<DataStream_&,_CAddress::SerParams> *)std::iostream_category();
        local_40.m_params = (SerParams *)CONCAT44(local_40.m_params._4_4_,1);
        std::ios_base::failure[abi:cxx11]::failure
                  (pcVar3,(error_code *)"Unsupported CAddress disk format version");
        if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
          __cxa_throw(pcVar3,&std::ios_base::failure[abi:cxx11]::typeinfo,
                      std::ios_base::failure[abi:cxx11]::~failure);
        }
        goto LAB_00250cf6;
      }
    }
    else {
      bVar5 = false;
    }
  }
  local_40.m_params =
       (SerParams *)
       CONCAT44(local_40.m_params._4_4_,obj[1].m_addr._union.indirect_contents.capacity);
  std::vector<std::byte,zero_after_free_allocator<std::byte>>::_M_range_insert<std::byte_const*>
            ((vector<std::byte,zero_after_free_allocator<std::byte>> *)s->m_substream,
             (s->m_substream->vch).
             super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
             super__Vector_impl_data._M_finish,&local_40);
  pSVar4 = *(SerParams **)&obj[1].m_addr._size;
  if (bVar5) {
    WriteCompactSize<ParamsStream<DataStream&,CAddress::SerParams>>(s,(uint64_t)pSVar4);
    pSVar4 = &CNetAddr::V2;
  }
  else {
    local_40.m_params = pSVar4;
    std::vector<std::byte,zero_after_free_allocator<std::byte>>::_M_range_insert<std::byte_const*>
              ((vector<std::byte,zero_after_free_allocator<std::byte>> *)s->m_substream,
               (s->m_substream->vch).
               super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
               super__Vector_impl_data._M_finish,&local_40);
    pSVar4 = &CNetAddr::V1;
  }
  local_44.enc = pSVar4->enc;
  local_40.m_params = &local_44;
  local_30.m_object = (unsigned_short *)(obj + 1);
  local_40.m_substream = s;
  SerializeMany<ParamsStream<ParamsStream<DataStream&,CAddress::SerParams>&,CNetAddr::SerParams>,CNetAddr,Wrapper<CustomUintFormatter<2,true>,unsigned_short_const&>>
            (&local_40,obj,&local_30);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
LAB_00250cf6:
  __stack_chk_fail();
}

Assistant:

SERIALIZE_METHODS(CAddress, obj)
    {
        bool use_v2;
        auto& params = SER_PARAMS(SerParams);
        if (params.fmt == Format::Disk) {
            // In the disk serialization format, the encoding (v1 or v2) is determined by a flag version
            // that's part of the serialization itself. ADDRV2_FORMAT in the stream version only determines
            // whether V2 is chosen/permitted at all.
            uint32_t stored_format_version = DISK_VERSION_INIT;
            if (params.enc == Encoding::V2) stored_format_version |= DISK_VERSION_ADDRV2;
            READWRITE(stored_format_version);
            stored_format_version &= ~DISK_VERSION_IGNORE_MASK; // ignore low bits
            if (stored_format_version == 0) {
                use_v2 = false;
            } else if (stored_format_version == DISK_VERSION_ADDRV2 && params.enc == Encoding::V2) {
                // Only support v2 deserialization if V2 is set.
                use_v2 = true;
            } else {
                throw std::ios_base::failure("Unsupported CAddress disk format version");
            }
        } else {
            assert(params.fmt == Format::Network);
            // In the network serialization format, the encoding (v1 or v2) is determined directly by
            // the value of enc in the stream params, as no explicitly encoded version
            // exists in the stream.
            use_v2 = params.enc == Encoding::V2;
        }

        READWRITE(Using<LossyChronoFormatter<uint32_t>>(obj.nTime));
        // nServices is serialized as CompactSize in V2; as uint64_t in V1.
        if (use_v2) {
            uint64_t services_tmp;
            SER_WRITE(obj, services_tmp = obj.nServices);
            READWRITE(Using<CompactSizeFormatter<false>>(services_tmp));
            SER_READ(obj, obj.nServices = static_cast<ServiceFlags>(services_tmp));
        } else {
            READWRITE(Using<CustomUintFormatter<8>>(obj.nServices));
        }
        // Invoke V1/V2 serializer for CService parent object.
        const auto ser_params{use_v2 ? CNetAddr::V2 : CNetAddr::V1};
        READWRITE(ser_params(AsBase<CService>(obj)));
    }